

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

ma_result ma_fader_process_pcm_frames
                    (ma_fader *pFader,void *pFramesOut,void *pFramesIn,ma_uint64 frameCount)

{
  float fVar1;
  float fVar2;
  ma_uint64 mVar3;
  ulong local_70;
  float volume;
  float a;
  float *pFramesOutF32;
  float *pFramesInF32;
  ulong uStack_48;
  ma_uint32 iChannel;
  ma_uint64 iFrame;
  ma_uint64 frameCount_local;
  void *pFramesIn_local;
  void *pFramesOut_local;
  ma_fader *pFader_local;
  float r1;
  float r0;
  
  if (pFader == (ma_fader *)0x0) {
    pFader_local._0_4_ = MA_INVALID_ARGS;
  }
  else {
    iFrame = frameCount;
    if (0xffffffff < frameCount + pFader->cursorInFrames) {
      iFrame = 0xffffffff - pFader->cursorInFrames;
    }
    if ((pFader->volumeBeg != pFader->volumeEnd) ||
       (NAN(pFader->volumeBeg) || NAN(pFader->volumeEnd))) {
      if (pFader->cursorInFrames < pFader->lengthInFrames) {
        if ((pFader->config).format != ma_format_f32) {
          return MA_NOT_IMPLEMENTED;
        }
        for (uStack_48 = 0; uStack_48 < iFrame; uStack_48 = uStack_48 + 1) {
          if (pFader->cursorInFrames + uStack_48 < pFader->lengthInFrames) {
            local_70 = pFader->cursorInFrames + uStack_48;
          }
          else {
            local_70 = pFader->lengthInFrames;
          }
          mVar3 = pFader->lengthInFrames;
          fVar1 = pFader->volumeBeg;
          fVar2 = pFader->volumeEnd;
          for (pFramesInF32._4_4_ = 0; pFramesInF32._4_4_ < (pFader->config).channels;
              pFramesInF32._4_4_ = pFramesInF32._4_4_ + 1) {
            *(float *)((long)pFramesOut +
                      (uStack_48 * (pFader->config).channels + (ulong)pFramesInF32._4_4_) * 4) =
                 *(float *)((long)pFramesIn +
                           (uStack_48 * (pFader->config).channels + (ulong)pFramesInF32._4_4_) * 4)
                 * (fVar1 + (fVar2 - fVar1) * ((float)(local_70 & 0xffffffff) / (float)(uint)mVar3))
            ;
          }
        }
      }
      else {
        ma_copy_and_apply_volume_and_clip_pcm_frames
                  (pFramesOut,pFramesIn,iFrame,(pFader->config).format,(pFader->config).channels,
                   pFader->volumeEnd);
      }
    }
    else if ((pFader->volumeBeg != 1.0) || (NAN(pFader->volumeBeg))) {
      ma_copy_and_apply_volume_and_clip_pcm_frames
                (pFramesOut,pFramesIn,iFrame,(pFader->config).format,(pFader->config).channels,
                 pFader->volumeEnd);
    }
    else {
      ma_copy_pcm_frames(pFramesOut,pFramesIn,iFrame,(pFader->config).format,
                         (pFader->config).channels);
    }
    pFader->cursorInFrames = iFrame + pFader->cursorInFrames;
    pFader_local._0_4_ = MA_SUCCESS;
  }
  return (ma_result)pFader_local;
}

Assistant:

MA_API ma_result ma_fader_process_pcm_frames(ma_fader* pFader, void* pFramesOut, const void* pFramesIn, ma_uint64 frameCount)
{
    if (pFader == NULL) {
        return MA_INVALID_ARGS;
    }

    /*
    For now we need to clamp frameCount so that the cursor never overflows 32-bits. This is required for
    the conversion to a float which we use for the linear interpolation. This might be changed later.
    */
    if (frameCount + pFader->cursorInFrames > UINT_MAX) {
        frameCount = UINT_MAX - pFader->cursorInFrames;
    }

    /* Optimized path if volumeBeg and volumeEnd are equal. */
    if (pFader->volumeBeg == pFader->volumeEnd) {
        if (pFader->volumeBeg == 1) {
            /* Straight copy. */
            ma_copy_pcm_frames(pFramesOut, pFramesIn, frameCount, pFader->config.format, pFader->config.channels);
        } else {
            /* Copy with volume. */
            ma_copy_and_apply_volume_and_clip_pcm_frames(pFramesOut, pFramesIn, frameCount, pFader->config.format, pFader->config.channels, pFader->volumeEnd);
        }
    } else {
        /* Slower path. Volumes are different, so may need to do an interpolation. */
        if (pFader->cursorInFrames >= pFader->lengthInFrames) {
            /* Fast path. We've gone past the end of the fade period so just apply the end volume to all samples. */
            ma_copy_and_apply_volume_and_clip_pcm_frames(pFramesOut, pFramesIn, frameCount, pFader->config.format, pFader->config.channels, pFader->volumeEnd);
        } else {
            /* Slow path. This is where we do the actual fading. */
            ma_uint64 iFrame;
            ma_uint32 iChannel;

            /* For now we only support f32. Support for other formats will be added later. */
            if (pFader->config.format == ma_format_f32) {
                const float* pFramesInF32  = (const float*)pFramesIn;
                /* */ float* pFramesOutF32 = (      float*)pFramesOut;

                for (iFrame = 0; iFrame < frameCount; iFrame += 1) {
                    float a = (ma_uint32)ma_min(pFader->cursorInFrames + iFrame, pFader->lengthInFrames) / (float)((ma_uint32)pFader->lengthInFrames);   /* Safe cast due to the frameCount clamp at the top of this function. */
                    float volume = ma_mix_f32_fast(pFader->volumeBeg, pFader->volumeEnd, a);

                    for (iChannel = 0; iChannel < pFader->config.channels; iChannel += 1) {
                        pFramesOutF32[iFrame*pFader->config.channels + iChannel] = pFramesInF32[iFrame*pFader->config.channels + iChannel] * volume;
                    }
                }
            } else {
                return MA_NOT_IMPLEMENTED;
            }
        }
    }

    pFader->cursorInFrames += frameCount;

    return MA_SUCCESS;
}